

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O2

char * from_string_nonull(JsonnetVm *vm,string *v,size_t *buflen)

{
  size_t __n;
  char *__dest;
  
  __dest = jsonnet_realloc(vm,(char *)0x0,v->_M_string_length);
  __n = v->_M_string_length;
  memcpy(__dest,(v->_M_dataplus)._M_p,__n);
  *buflen = __n;
  return __dest;
}

Assistant:

static char *from_string_nonull(JsonnetVm *vm, const std::string &v, size_t *buflen)
{
    char *r = jsonnet_realloc(vm, nullptr, v.length());
    std::memcpy(r, v.data(), v.length());
    *buflen = v.length();
    return r;
}